

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_rope_multi(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_tensor *c,int n_dims,
               int *sections,int mode,int n_ctx_orig,float freq_base,float freq_scale,
               float ext_factor,float attn_factor,float beta_fast,float beta_slow)

{
  _Bool _Var1;
  ggml_tensor *tensor;
  char *pcVar2;
  int line;
  long local_78;
  ulong uStack_70;
  int local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  
  if ((mode & 1U) == 0) {
    _Var1 = ggml_is_vector(b);
    if (_Var1) {
      if (b->type == GGML_TYPE_I32) {
        if (a->ne[2] << 2 == b->ne[0]) {
          if (c == (ggml_tensor *)0x0) {
LAB_001229db:
            tensor = ggml_dup_tensor(ctx,a);
            local_78 = (ulong)(uint)n_dims << 0x20;
            uStack_70 = (ulong)(uint)mode;
            local_68 = n_ctx_orig;
            local_4c = *(undefined8 *)sections;
            uStack_44 = *(undefined8 *)(sections + 2);
            local_64 = freq_base;
            local_60 = freq_scale;
            local_5c = ext_factor;
            local_58 = attn_factor;
            local_54 = beta_fast;
            local_50 = beta_slow;
            ggml_set_op_params(tensor,&local_78,0x3c);
            tensor->op = GGML_OP_ROPE;
            tensor->src[0] = a;
            tensor->src[1] = b;
            tensor->src[2] = c;
            return tensor;
          }
          if (c->type == GGML_TYPE_F32) {
            if ((long)(n_dims / 2) <= c->ne[0]) goto LAB_001229db;
            pcVar2 = "c->ne[0] >= n_dims / 2";
            line = 0xe2a;
          }
          else {
            pcVar2 = "c->type == GGML_TYPE_F32";
            line = 0xe29;
          }
        }
        else {
          pcVar2 = "a->ne[2] * 4 == b->ne[0]";
          line = 0xe26;
        }
      }
      else {
        pcVar2 = "b->type == GGML_TYPE_I32";
        line = 0xe25;
      }
    }
    else {
      pcVar2 = "ggml_is_vector(b)";
      line = 0xe24;
    }
  }
  else {
    pcVar2 = "(mode & 1) == 0 && \"mode & 1 == 1 is no longer supported\"";
    line = 0xe22;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_rope_multi(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        struct ggml_tensor  * c,
        int                   n_dims,
        int                   sections[4],
        int                   mode,
        int                   n_ctx_orig,
        float                 freq_base,
        float                 freq_scale,
        float                 ext_factor,
        float                 attn_factor,
        float                 beta_fast,
        float                 beta_slow) {
    // Multimodal Rotary Position Embedding
    GGML_ASSERT((mode & 1) == 0 && "mode & 1 == 1 is no longer supported");

    GGML_ASSERT(ggml_is_vector(b));
    GGML_ASSERT(b->type == GGML_TYPE_I32);
    GGML_ASSERT(a->ne[2] * 4 == b->ne[0]); // mrope expecting 4 position ids per token

    if (c) {
        GGML_ASSERT(c->type == GGML_TYPE_F32);
        GGML_ASSERT(c->ne[0] >= n_dims / 2);
    }

    struct ggml_tensor * result = ggml_dup_tensor(ctx, a);

    int32_t params[11 + 4] = { /*n_past*/ 0, n_dims, mode, /*n_ctx*/ 0, n_ctx_orig };
    memcpy(params +  5, &freq_base,    sizeof(float));
    memcpy(params +  6, &freq_scale,   sizeof(float));
    memcpy(params +  7, &ext_factor,   sizeof(float));
    memcpy(params +  8, &attn_factor,  sizeof(float));
    memcpy(params +  9, &beta_fast,    sizeof(float));
    memcpy(params + 10, &beta_slow,    sizeof(float));
    memcpy(&params[11], sections,      sizeof(int)*4);
    ggml_set_op_params(result, params, sizeof(params));

    result->op   = GGML_OP_ROPE;
    result->src[0] = a;
    result->src[1] = b;
    result->src[2] = c;

    return result;
}